

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void doXPathQuery(xmllintState *lint,xmlDocPtr doc,char *query)

{
  long lVar1;
  xmlXPathObjectPtr local_38;
  xmlXPathObjectPtr res;
  xmlXPathCompExprPtr comp;
  xmlXPathContextPtr_conflict ctxt;
  char *query_local;
  xmlDocPtr doc_local;
  xmllintState *lint_local;
  
  res = (xmlXPathObjectPtr)0x0;
  local_38 = (xmlXPathObjectPtr)0x0;
  lVar1 = xmlXPathNewContext(doc);
  if (lVar1 == 0) {
    lint->progresult = XMLLINT_ERR_MEM;
  }
  else {
    res = (xmlXPathObjectPtr)xmlXPathCtxtCompile(lVar1,query);
    if (res == (xmlXPathObjectPtr)0x0) {
      fprintf((FILE *)lint->errStream,"XPath compilation failure\n");
      lint->progresult = XMLLINT_ERR_XPATH;
    }
    else {
      if (lint->debug != 0) {
        xmlXPathDebugDumpCompExpr(_stdout,res,0);
        printf("\n");
      }
      *(xmlDocPtr *)(lVar1 + 8) = doc;
      local_38 = (xmlXPathObjectPtr)xmlXPathCompiledEval(res,lVar1);
      if (local_38 == (xmlXPathObjectPtr)0x0) {
        fprintf((FILE *)lint->errStream,"XPath evaluation failure\n");
        lint->progresult = XMLLINT_ERR_XPATH;
      }
      else {
        doXPathDump(lint,local_38);
      }
    }
  }
  xmlXPathFreeObject(local_38);
  xmlXPathFreeCompExpr(res);
  xmlXPathFreeContext(lVar1);
  return;
}

Assistant:

static void
doXPathQuery(xmllintState *lint, xmlDocPtr doc, const char *query) {
    xmlXPathContextPtr ctxt = NULL;
    xmlXPathCompExprPtr comp = NULL;
    xmlXPathObjectPtr res = NULL;

    ctxt = xmlXPathNewContext(doc);
    if (ctxt == NULL) {
        lint->progresult = XMLLINT_ERR_MEM;
        goto error;
    }

    comp = xmlXPathCtxtCompile(ctxt, BAD_CAST query);
    if (comp == NULL) {
        fprintf(lint->errStream, "XPath compilation failure\n");
        lint->progresult = XMLLINT_ERR_XPATH;
        goto error;
    }

#ifdef LIBXML_DEBUG_ENABLED
    if (lint->debug) {
        xmlXPathDebugDumpCompExpr(stdout, comp, 0);
        printf("\n");
    }
#endif

    ctxt->node = (xmlNodePtr) doc;
    res = xmlXPathCompiledEval(comp, ctxt);
    if (res == NULL) {
        fprintf(lint->errStream, "XPath evaluation failure\n");
        lint->progresult = XMLLINT_ERR_XPATH;
        goto error;
    }

    doXPathDump(lint, res);

error:
    xmlXPathFreeObject(res);
    xmlXPathFreeCompExpr(comp);
    xmlXPathFreeContext(ctxt);
}